

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O0

ImageList * __thiscall aeron::Subscription::addImage(Subscription *this,Image *image)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ImageList *pIVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  ImageList *this_00;
  Image *images;
  long in_RDI;
  ulong uVar7;
  ImageList *newImageList;
  size_t i;
  Image *newArray;
  size_t length;
  Image *oldArray;
  ImageList *oldImageList;
  Image *in_stack_ffffffffffffff58;
  Image *in_stack_ffffffffffffff60;
  Image *this_01;
  Image *local_78;
  ulong local_48;
  
  pIVar3 = std::atomic_load_explicit<aeron::ImageList*>
                     ((atomic<aeron::ImageList_*> *)(in_RDI + 0x50),memory_order_acquire);
  uVar1 = pIVar3->m_length;
  uVar4 = uVar1 + 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(0x128),0);
  uVar7 = uVar5 + 8;
  if (SUB168(auVar2 * ZEXT816(0x128),8) != 0 || 0xfffffffffffffff7 < uVar5) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar7);
  *puVar6 = uVar4;
  images = (Image *)(puVar6 + 1);
  if (uVar4 != 0) {
    this_01 = images + uVar4;
    local_78 = images;
    do {
      Image::Image(this_01);
      local_78 = local_78 + 1;
    } while (local_78 != this_01);
  }
  for (local_48 = 0; local_48 < uVar1; local_48 = local_48 + 1) {
    Image::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  Image::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this_00 = (ImageList *)operator_new(0x10);
  ImageList::ImageList(this_00,images,uVar1 + 1);
  std::atomic_store_explicit<aeron::ImageList*>
            ((atomic<aeron::ImageList_*> *)this_00,
             (__atomic_val_t<aeron::ImageList_*>)in_stack_ffffffffffffff58,memory_order_relaxed);
  return pIVar3;
}

Assistant:

struct ImageList *addImage(Image &image)
    {
        struct ImageList *oldImageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        Image *oldArray = oldImageList->m_images;
        std::size_t length = oldImageList->m_length;
        auto newArray = new Image[length + 1];

        for (std::size_t i = 0; i < length; i++)
        {
            newArray[i] = oldArray[i];
        }

        newArray[length] = image; // copy-assign

        auto newImageList = new struct ImageList(newArray, length + 1);

        std::atomic_store_explicit(&m_imageList, newImageList, std::memory_order_release);

        return oldImageList;
    }